

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week12-app3.cpp
# Opt level: O0

ostream * operator<<(ostream *str,Student *stu)

{
  ostream *poVar1;
  void *this;
  Student *stu_local;
  ostream *str_local;
  
  poVar1 = std::operator<<(str,(string *)stu);
  poVar1 = std::operator<<(poVar1,", ");
  this = (void *)std::ostream::operator<<(poVar1,(stu->gpa).value);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return str;
}

Assistant:

std::ostream& operator<<(std::ostream& str, const Student& stu)
{
    str << stu.name << ", " << stu.gpa.value << std::endl;
    return str;
}